

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

NativeEntryPointData * __thiscall
Js::EntryPointInfo::EnsureNativeEntryPointData(EntryPointInfo *this)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  InProcNativeEntryPointData *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  this_00 = (InProcNativeEntryPointData *)(this->nativeEntryPointData).ptr;
  if (this_00 == (InProcNativeEntryPointData *)0x0) {
    pSVar1 = GetScriptContext(this);
    local_40 = (undefined1  [8])&InProcNativeEntryPointData::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x2044;
    alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_40);
    this_00 = (InProcNativeEntryPointData *)new<Memory::Recycler>(0xe0,alloc,0x37a1d4);
    InProcNativeEntryPointData::InProcNativeEntryPointData(this_00);
    Memory::WriteBarrierPtr<NativeEntryPointData>::WriteBarrierSet
              (&this->nativeEntryPointData,(NativeEntryPointData *)this_00);
  }
  return &this_00->super_NativeEntryPointData;
}

Assistant:

NativeEntryPointData * EntryPointInfo::EnsureNativeEntryPointData()
    {
        NativeEntryPointData * data = this->nativeEntryPointData;
        if (data == nullptr)
        {
#if ENABLE_OOP_NATIVE_CODEGEN
            if (JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), OOPNativeEntryPointData);
            }
            else
#endif
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), InProcNativeEntryPointData);
            }
            this->nativeEntryPointData = data;
        }
        return data;
    }